

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  uint uVar1;
  GCtrace *pGVar2;
  IRIns *pIVar3;
  bool bVar4;
  int local_410;
  IRRef local_40c;
  GCtrace *local_408;
  IRIns *ir_1;
  IRIns *ir;
  IRRef nins;
  ASMState *as;
  ASMState as_;
  GCtrace *T_local;
  jit_State *J_local;
  IRRef ref;
  
  ir._4_4_ = T->nins;
  ir_1 = T->ir + (ir._4_4_ - 1);
  if (((ir_1->field_1).o == '\f') || ((ir_1->field_1).o == '\x14')) {
    do {
      ir._4_4_ = ir._4_4_ - 1;
      bVar4 = true;
      if (*(char *)((long)ir_1 + -3) != '\f') {
        bVar4 = *(char *)((long)ir_1 + -3) == '\x14';
      }
      ir_1 = ir_1 + -1;
    } while (bVar4);
    T->nins = ir._4_4_;
  }
  uVar1 = (J->cur).nins;
  as_._904_8_ = T;
  if (J->irtoplim <= uVar1) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar1 + 1;
  pIVar3 = (J->cur).ir + uVar1;
  (pIVar3->field_0).ot = 0xc00;
  (pIVar3->field_0).op2 = 0;
  (pIVar3->field_0).op1 = 0;
  (pIVar3->field_0).prev = 0;
  as_._264_8_ = as_._904_8_;
  as_.ir = (IRIns *)J;
  as_.curins = uVar1;
  pGVar2 = lj_trace_alloc(J->L,(GCtrace *)as_._904_8_);
  J->curfinal = pGVar2;
  as_.weakset = J->flags;
  as_.fuseref = J->loopref;
  as_.flagmcp = (MCode *)0x0;
  as_.phiset = 0;
  if (J->parent == 0) {
    local_408 = (GCtrace *)0x0;
  }
  else {
    local_408 = (GCtrace *)J->trace[J->parent].gcptr64;
  }
  as_.T = local_408;
  as_.cost._120_8_ = lj_mcode_reserve(J,(MCode **)&as_.parent);
  as_.mcp = (MCode *)&(as_.parent)->startpt;
  as_.mcbot = (MCode *)as_.cost._120_8_;
  as_.mctop = (MCode *)as_.cost._120_8_;
  asm_setup_target((ASMState *)&as);
  while( true ) {
    do {
      as_.cost._120_8_ = as_.mcbot;
      as_.mclim = (MCode *)J->curfinal->ir;
      (J->cur).nins = as_.curins;
      as_.evenspill = as_.curins;
      asm_tail_prep((ASMState *)&as);
      as_.mctoporig = (MCode *)0x0;
      as_.invmcp = (MCode *)0x0;
      as_.sectref = 0;
      as_.loopref = 0;
      as_.snapfilt2._4_4_ = as_.fuseref;
      if ((as_.weakset & 0x2000000) == 0) {
        local_40c = 0xffffffff;
      }
      else {
        local_40c = as_.fuseref;
      }
      as_.snapfilt2._0_4_ = local_40c;
      asm_setup_regsp((ASMState *)&as);
      if (as_.fuseref == 0) {
        asm_tail_link((ASMState *)&as);
      }
      while (as_.evenspill = as_.evenspill + -1, (uint)as_.oddspill < (uint)as_.evenspill) {
        pIVar3 = (IRIns *)(as_.mclim + (ulong)(uint)as_.evenspill * 8);
        asm_snap_prev((ASMState *)&as);
        if ((((((pIVar3->field_1).r & 0x80) == 0) || ((pIVar3->field_1).s != '\0')) ||
            (0x5f < (((pIVar3->field_1).t.irt | 0x7f) & lj_ir_mode[(pIVar3->field_1).o]))) ||
           ((as_.weakset & 0x40000) == 0)) {
          if (((pIVar3->field_1).t.irt & 0x80) != 0) {
            asm_snap_prep((ASMState *)&as);
          }
          if ((ulong)as_.cost._120_8_ < as_.mcp) {
            asm_mclimit((ASMState *)&as);
          }
          asm_ir((ASMState *)&as,pIVar3);
        }
      }
    } while ((as_.flagmcp != (MCode *)0x0) && (*(uint *)(as_._904_8_ + 0xc) <= J->curfinal->nins));
    if ((ulong)as_.cost._120_8_ < as_.mcp) {
      asm_mclimit((ASMState *)&as);
    }
    if (0 < (int)as_.loopref) {
      as_.evenspill = (int32_t)*(ushort *)(*(long *)(as_._264_8_ + 0x30) + 4);
      asm_snap_prep((ASMState *)&as);
      asm_gc_check((ASMState *)&as);
      as_.evenspill = as_.oddspill;
    }
    ra_evictk((ASMState *)&as);
    if (as_.T == (GCtrace *)0x0) {
      asm_head_root((ASMState *)&as);
    }
    else {
      asm_head_side((ASMState *)&as);
    }
    asm_phi_fixup((ASMState *)&as);
    if (*(uint *)(as_._904_8_ + 0xc) <= J->curfinal->nins) break;
    lj_trace_free((global_State *)(J[-1].penalty + 0x23),J->curfinal);
    J->curfinal = (GCtrace *)0x0;
    pGVar2 = lj_trace_alloc(J->L,(GCtrace *)as_._904_8_);
    J->curfinal = pGVar2;
    as_.flagmcp = (MCode *)0x0;
  }
  memcpy(J->curfinal->ir + as_.curins,
         (void *)(*(long *)(as_._904_8_ + 0x20) + (ulong)as_.curins * 8),
         (ulong)(*(int *)(as_._904_8_ + 0xc) - as_.curins) << 3);
  *(IRRef *)(as_._904_8_ + 0xc) = J->curfinal->nins;
  as_.evenspill = 0x8001;
  asm_snap_prev((ASMState *)&as);
  if (as_.mrm.ofs == -0x4011) {
    *(undefined8 *)(as_._904_8_ + 0x58) = as_.cost._120_8_;
    if (as_.mctoporig == (MCode *)0x0) {
      local_410 = 0;
    }
    else {
      local_410 = (int)as_.mctoporig - as_.cost[0x1e];
    }
    *(int *)(as_._904_8_ + 0x60) = local_410;
    if (as_.fuseref == 0) {
      asm_tail_fixup((ASMState *)&as,(uint)*(ushort *)(as_._904_8_ + 0x6a));
    }
    else {
      asm_loop_tail_fixup((ASMState *)&as);
    }
    *(RegCost *)(as_._904_8_ + 0x54) = (int)as_.mcbot - as_.cost[0x1e];
    asm_snap_fixup_mcofs((ASMState *)&as);
    lj_mcode_sync(*(void **)(as_._904_8_ + 0x58),as_.mctop);
    return;
  }
  lj_trace_err((jit_State *)&(as_.ir)->field_0,LJ_TRERR_BADRA);
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;
#ifdef LUAJIT_RANDOM_RA
  (void)lj_prng_u64(&J2G(J)->prng);  /* Ensure PRNG step between traces. */
#endif

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;
#ifdef LUAJIT_RANDOM_RA
    as->prngstate = J2G(J)->prng;  /* Must (re)start from identical state. */
    as->prngbits = 0;
#endif

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (as->loopref)
    asm_loop_tail_fixup(as);
  else
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}